

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O1

string_view __thiscall wabt::anon_unknown_7::NameApplier::FindLabelByVar(NameApplier *this,Var *var)

{
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  pointer pcVar5;
  long lVar6;
  long lVar7;
  pointer pbVar8;
  size_t __n;
  string_view sVar9;
  
  if (var->type_ == Index) {
    pbVar8 = (this->labels_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(this->labels_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8;
    pcVar5 = (pointer)0x0;
    __n = 0;
    if ((ulong)(var->field_2).index_ < (ulong)(lVar6 >> 5)) {
      lVar7 = ~(ulong)(var->field_2).index_ * 0x20;
      pcVar5 = *(pointer *)((long)pbVar8 + lVar7 + lVar6);
      __n = *(size_t *)((long)pbVar8 + lVar7 + 8 + lVar6);
    }
  }
  else {
    if (var->type_ != Name) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.h"
                    ,0x36,"Index wabt::Var::index() const");
    }
    pbVar8 = (this->labels_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (int)((ulong)((long)(this->labels_).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) >> 5) - 1
    ;
    if ((int)uVar3 < 0) {
      pcVar5 = (pointer)0x0;
      __n = 0;
    }
    else {
      sVar1 = (var->field_2).name_._M_string_length;
      pbVar8 = pbVar8 + uVar3;
      lVar6 = (ulong)uVar3 + 1;
      do {
        __n = pbVar8->_M_string_length;
        if (__n == sVar1) {
          if (__n != 0) {
            iVar4 = bcmp((pbVar8->_M_dataplus)._M_p,(var->field_2).name_._M_dataplus._M_p,__n);
            if (iVar4 != 0) goto LAB_00f3cfd6;
          }
          pcVar5 = (pbVar8->_M_dataplus)._M_p;
          goto LAB_00f3d02f;
        }
LAB_00f3cfd6:
        pbVar8 = pbVar8 + -1;
        lVar7 = lVar6 + -1;
        bVar2 = 0 < lVar6;
        lVar6 = lVar7;
      } while (lVar7 != 0 && bVar2);
      __n = 0;
      pcVar5 = (pointer)0x0;
    }
  }
LAB_00f3d02f:
  sVar9.size_ = __n;
  sVar9.data_ = pcVar5;
  return sVar9;
}

Assistant:

string_view NameApplier::FindLabelByVar(Var* var) {
  if (var->is_name()) {
    for (int i = labels_.size() - 1; i >= 0; --i) {
      const std::string& label = labels_[i];
      if (label == var->name()) {
        return label;
      }
    }
    return string_view();
  } else {
    if (var->index() >= labels_.size()) {
      return string_view();
    }
    return labels_[labels_.size() - 1 - var->index()];
  }
}